

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md4c.c
# Opt level: O2

int md_process_table_cell
              (MD_CTX *ctx,MD_BLOCKTYPE cell_type,MD_ALIGN align,MD_OFFSET beg,MD_OFFSET end)

{
  int iVar1;
  ulong uVar2;
  _func_void_char_ptr_void_ptr *p_Var3;
  ulong uVar4;
  void *pvVar5;
  ulong uVar6;
  char *pcVar7;
  MD_BLOCK_TD_DETAIL det;
  MD_LINE line;
  
  uVar6 = (ulong)beg;
  uVar2 = (ulong)end;
  uVar4 = (ulong)beg;
  if (beg < end) {
    uVar4 = (ulong)end;
  }
  for (; uVar6 < uVar2; uVar6 = uVar6 + 1) {
    if ((0x20 < (ulong)(byte)ctx->text[uVar6]) ||
       ((0x100001a00U >> ((ulong)(byte)ctx->text[uVar6] & 0x3f) & 1) == 0)) {
      uVar4 = uVar6 & 0xffffffff;
      break;
    }
  }
  line.beg = (MD_OFFSET)uVar4;
  uVar6 = (ulong)end;
  if (line.beg < end) {
    uVar6 = uVar4;
  }
  do {
    line.end = (MD_OFFSET)uVar6;
    if (uVar2 <= uVar4) {
LAB_00108512:
      det.align = align;
      iVar1 = (*(ctx->parser).enter_block)(cell_type,&det,ctx->userdata);
      if (iVar1 == 0) {
        iVar1 = md_process_normal_block_contents(ctx,&line,1);
        if (iVar1 < 0) {
          return iVar1;
        }
        iVar1 = (*(ctx->parser).leave_block)(cell_type,&det,ctx->userdata);
        if (iVar1 == 0) {
          return 0;
        }
        p_Var3 = (ctx->parser).debug_log;
        if (p_Var3 == (_func_void_char_ptr_void_ptr *)0x0) {
          return iVar1;
        }
        pvVar5 = ctx->userdata;
        pcVar7 = "Aborted from leave_block() callback.";
      }
      else {
        p_Var3 = (ctx->parser).debug_log;
        if (p_Var3 == (_func_void_char_ptr_void_ptr *)0x0) {
          return iVar1;
        }
        pvVar5 = ctx->userdata;
        pcVar7 = "Aborted from enter_block() callback.";
      }
      (*p_Var3)(pcVar7,pvVar5);
      return iVar1;
    }
    if ((0x20 < (ulong)(byte)ctx->text[uVar2 - 1]) ||
       ((0x100001a00U >> ((ulong)(byte)ctx->text[uVar2 - 1] & 0x3f) & 1) == 0)) {
      line.end = (MD_OFFSET)uVar2;
      goto LAB_00108512;
    }
    uVar2 = uVar2 - 1;
  } while( true );
}

Assistant:

static int
md_process_table_cell(MD_CTX* ctx, MD_BLOCKTYPE cell_type, MD_ALIGN align, OFF beg, OFF end)
{
    MD_LINE line;
    MD_BLOCK_TD_DETAIL det;
    int ret = 0;

    while(beg < end  &&  ISWHITESPACE(beg))
        beg++;
    while(end > beg  &&  ISWHITESPACE(end-1))
        end--;

    det.align = align;
    line.beg = beg;
    line.end = end;

    MD_ENTER_BLOCK(cell_type, &det);
    MD_CHECK(md_process_normal_block_contents(ctx, &line, 1));
    MD_LEAVE_BLOCK(cell_type, &det);

abort:
    return ret;
}